

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::usdc::USDCReader::Impl::ReconstructStage(Impl *this,Stage *stage)

{
  CrateReader *pCVar1;
  pointer pPVar2;
  pointer pPVar3;
  bool bVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  ostream *poVar7;
  pointer pSVar8;
  long lVar9;
  ulong uVar10;
  pointer this_00;
  PathIndexToSpecIndexMap path_index_to_spec_index_map;
  ostringstream ss_w;
  string local_200;
  undefined1 local_1e0 [32];
  float local_1c0;
  size_t local_1b8;
  __node_base_ptr p_Stack_1b0;
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
  local_1a8 [4];
  ios_base local_138 [264];
  
  pCVar1 = this->crate_reader;
  if ((pCVar1->_nodes).
      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pCVar1->_nodes).
      super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[warn]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"ReconstructStage",0x10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0xd9a);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Empty scene.",0xc);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushWarn(this,(string *)local_1e0);
    if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
      operator_delete((void *)local_1e0._0_8_,(ulong)(local_1e0._16_8_ + 1));
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    ::std::ios_base::~ios_base(local_138);
    bVar4 = true;
  }
  else {
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::vector(local_1a8,&pCVar1->_nodes);
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::operator=(&this->_nodes,local_1a8);
    ::std::
    vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
    ::~vector(local_1a8);
    ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::operator=
              (&this->_specs,&this->crate_reader->_specs);
    ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::operator=
              (&this->_fields,&this->crate_reader->_fields);
    ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::operator=
              (&this->_fieldset_indices,&this->crate_reader->_fieldset_indices);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &this->crate_reader->_paths);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_elemPaths,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               &this->crate_reader->_elemPaths);
    ::std::
    _Rb_tree<tinyusdz::crate::Index,_std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>,_std::_Select1st<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
    ::operator=(&(this->_live_fieldsets)._M_t,&(this->crate_reader->_live_fieldsets)._M_t);
    local_1e0._0_8_ = &p_Stack_1b0;
    local_1e0._8_8_ = 1;
    local_1e0._16_8_ = (_Hash_node_base *)0x0;
    local_1e0._24_8_ = 0;
    local_1c0 = 1.0;
    local_1b8 = 0;
    p_Stack_1b0 = (__node_base_ptr)0x0;
    pSVar8 = (this->_specs).
             super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->_specs).
        super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar8) {
      lVar9 = 0;
      uVar10 = 0;
      do {
        if (*(int *)((long)&(pSVar8->path_index).value + lVar9) != -1) {
          sVar5 = ::std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_1e0,
                          (key_type_conflict1 *)((long)&(pSVar8->path_index).value + lVar9));
          if (sVar5 != 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructStage",0x10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0xdb2);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Multiple PathIndex found in Crate data.",0x27);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(this,&local_200);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) {
              operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            bVar4 = false;
            goto LAB_0018e928;
          }
          pmVar6 = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_1e0,
                                (key_type *)
                                ((long)&(((this->_specs).
                                          super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->path_index).
                                        value + lVar9));
          *pmVar6 = (mapped_type)uVar10;
        }
        uVar10 = uVar10 + 1;
        pSVar8 = (this->_specs).
                 super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar9 = lVar9 + 0xc;
      } while (uVar10 < (ulong)(((long)(this->_specs).
                                       super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >>
                                2) * -0x5555555555555555));
    }
    pPVar2 = (stage->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar3 = (stage->_root_nodes).
             super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_00 = pPVar2;
    if (pPVar3 != pPVar2) {
      do {
        Prim::~Prim(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pPVar3);
      (stage->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
      _M_impl.super__Vector_impl_data._M_finish = pPVar2;
    }
    bVar4 = ReconstructPrimRecursively
                      (this,-1,0,(Prim *)0x0,0,(PathIndexToSpecIndexMap *)local_1e0,stage);
    if (bVar4) {
      Stage::compute_absolute_prim_path_and_assign_prim_id(stage,true);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"ReconstructStage",0x10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar7 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0xdc4);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Failed to reconstruct Stage(Prim hierarchy)",0x2b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      ::std::ios_base::~ios_base(local_138);
    }
LAB_0018e928:
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_1e0);
  }
  return bVar4;
}

Assistant:

bool USDCReader::Impl::ReconstructStage(Stage *stage) {

  // format test
  DCOUT(fmt::format("# of Paths = {}", crate_reader->NumPaths()));

  if (crate_reader->NumNodes() == 0) {
    PUSH_WARN("Empty scene.");
    return true;
  }

  // TODO: Directly access data in crate_reader.
  _nodes = crate_reader->GetNodes();
  _specs = crate_reader->GetSpecs();
  _fields = crate_reader->GetFields();
  _fieldset_indices = crate_reader->GetFieldsetIndices();
  _paths = crate_reader->GetPaths();
  _elemPaths = crate_reader->GetElemPaths();
  _live_fieldsets = crate_reader->GetLiveFieldSets();

  PathIndexToSpecIndexMap
      path_index_to_spec_index_map;  // path_index -> spec_index

  {
    for (size_t i = 0; i < _specs.size(); i++) {
      if (_specs[i].path_index.value == ~0u) {
        continue;
      }

      // path_index should be unique.
      if (path_index_to_spec_index_map.count(_specs[i].path_index.value) != 0) {
        PUSH_ERROR_AND_RETURN("Multiple PathIndex found in Crate data.");
      }

      DCOUT(fmt::format("path index[{}] -> spec index [{}]",
                        _specs[i].path_index.value, uint32_t(i)));
      path_index_to_spec_index_map[_specs[i].path_index.value] = uint32_t(i);
    }
  }

  stage->root_prims().clear();

  int root_node_id = 0;
  bool ret = ReconstructPrimRecursively(/* no further root for root_node */ -1,
                                        root_node_id, /* root Prim */ nullptr,
                                        /* level */ 0,
                                        path_index_to_spec_index_map, stage);

  if (!ret) {
    PUSH_ERROR_AND_RETURN("Failed to reconstruct Stage(Prim hierarchy)");
  }

  stage->compute_absolute_prim_path_and_assign_prim_id();

  return true;
}